

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

Column * Catch::TextFlow::Spacer(Column *__return_storage_ptr__,size_t spaceWidth)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  Column::Column(__return_storage_ptr__,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  Column::width(__return_storage_ptr__,spaceWidth);
  return __return_storage_ptr__;
}

Assistant:

Column Spacer( size_t spaceWidth ) {
            Column ret{ "" };
            ret.width( spaceWidth );
            return ret;
        }